

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::ImageT
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t width,size_t height,
          Col3<unsigned_char> *color,string *name)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 *in_RCX;
  undefined1 *puVar6;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  string *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff98;
  Image *in_stack_ffffffffffffffa0;
  ulong local_58;
  
  Image::Image(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)in_RDI,
               in_stack_ffffffffffffff88);
  *in_RDI = &PTR__ImageT_00443398;
  uVar2 = in_RSI * in_RDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(3),0);
  if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  if (uVar2 != 0) {
    pvVar5 = pvVar4;
    do {
      pvVar5 = (void *)((long)pvVar5 + 3);
    } while (pvVar5 != (void *)((long)pvVar4 + uVar2 * 3));
  }
  in_RDI[8] = pvVar4;
  for (local_58 = 0; local_58 < (ulong)(in_RSI * in_RDX); local_58 = local_58 + 1) {
    puVar6 = (undefined1 *)(in_RDI[8] + local_58 * 3);
    *puVar6 = *in_RCX;
    puVar6[1] = in_RCX[1];
    puVar6[2] = in_RCX[2];
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, const T& color, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      for (size_t i=0; i<width*height; i++) data[i] = color;
    }